

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float128 float128_div_mips64el(float128 a,float128 b,float_status *status)

{
  float128 a_00;
  float128 a_01;
  float128 a_02;
  float128 b_00;
  float128 b_01;
  float128 b_02;
  float128 a_03;
  float128 a_04;
  float128 a_05;
  float128 a_06;
  float128 a_07;
  float128 a_08;
  flag fVar1;
  uint64_t uVar2;
  float128 fVar3;
  uint64_t local_c8;
  uint64_t term3;
  uint64_t term2;
  uint64_t term1;
  uint64_t term0;
  uint64_t rem3;
  uint64_t rem2;
  uint64_t rem1;
  uint64_t rem0;
  uint64_t zSig2;
  uint64_t zSig1;
  uint64_t zSig0;
  uint64_t bSig1;
  uint64_t bSig0;
  uint64_t aSig1;
  uint64_t aSig0;
  int32_t zExp;
  int32_t bExp;
  int32_t aExp;
  flag zSign;
  flag bSign;
  flag aSign;
  float_status *status_local;
  float128 b_local;
  float128 a_local;
  
  b_local.low = b.high;
  status_local = (float_status *)b.low;
  uVar2 = a.high;
  b_local.high = a.low;
  _aExp = status;
  bSig0 = extractFloat128Frac1(a);
  a_03.high = uVar2;
  a_03.low = b_local.high;
  aSig1 = extractFloat128Frac0(a_03);
  a_04.high = uVar2;
  a_04.low = b_local.high;
  zExp = extractFloat128Exp(a_04);
  a_05.high = uVar2;
  a_05.low = b_local.high;
  bExp._3_1_ = extractFloat128Sign(a_05);
  fVar3.high = b_local.low;
  fVar3.low = (uint64_t)status_local;
  zSig0 = extractFloat128Frac1(fVar3);
  a_00.high = b_local.low;
  a_00.low = (uint64_t)status_local;
  bSig1 = extractFloat128Frac0(a_00);
  a_01.high = b_local.low;
  a_01.low = (uint64_t)status_local;
  aSig0._4_4_ = extractFloat128Exp(a_01);
  a_02.high = b_local.low;
  a_02.low = (uint64_t)status_local;
  bExp._2_1_ = extractFloat128Sign(a_02);
  bExp._1_1_ = bExp._3_1_ ^ bExp._2_1_;
  if (zExp == 0x7fff) {
    if (aSig1 != 0 || bSig0 != 0) {
      a_06.high = uVar2;
      a_06.low = b_local.high;
      b_00.high = b_local.low;
      b_00.low = (uint64_t)status_local;
      fVar3 = propagateFloat128NaN(a_06,b_00,_aExp);
      return fVar3;
    }
    if (aSig0._4_4_ != 0x7fff) {
      fVar3 = packFloat128(bExp._1_1_,0x7fff,0,0);
      return fVar3;
    }
    if (bSig1 != 0 || zSig0 != 0) {
      a_07.high = uVar2;
      a_07.low = b_local.high;
      b_01.high = b_local.low;
      b_01.low = (uint64_t)status_local;
      fVar3 = propagateFloat128NaN(a_07,b_01,_aExp);
      return fVar3;
    }
LAB_00c6d3ed:
    float_raise_mips64el('\x01',_aExp);
    join_0x00000010_0x00000000_ = float128_default_nan_mips64el(_aExp);
  }
  else {
    if (aSig0._4_4_ == 0x7fff) {
      if (bSig1 != 0 || zSig0 != 0) {
        a_08.high = uVar2;
        a_08.low = b_local.high;
        b_02.high = b_local.low;
        b_02.low = (uint64_t)status_local;
        fVar3 = propagateFloat128NaN(a_08,b_02,_aExp);
        return fVar3;
      }
      fVar3 = packFloat128(bExp._1_1_,0,0,0);
      return fVar3;
    }
    if (aSig0._4_4_ == 0) {
      if (bSig1 == 0 && zSig0 == 0) {
        if ((zExp != 0 || aSig1 != 0) || bSig0 != 0) {
          float_raise_mips64el('\x04',_aExp);
          fVar3 = packFloat128(bExp._1_1_,0x7fff,0,0);
          return fVar3;
        }
        goto LAB_00c6d3ed;
      }
      normalizeFloat128Subnormal(bSig1,zSig0,(int32_t *)((long)&aSig0 + 4),&bSig1,&zSig0);
    }
    if (zExp == 0) {
      if (aSig1 == 0 && bSig0 == 0) {
        fVar3 = packFloat128(bExp._1_1_,0,0,0);
        return fVar3;
      }
      normalizeFloat128Subnormal(aSig1,bSig0,&zExp,&aSig1,&bSig0);
    }
    aSig0._0_4_ = (zExp - aSig0._4_4_) + 0x3ffd;
    shortShift128Left(aSig1 | 0x1000000000000,bSig0,0xf,&aSig1,&bSig0);
    shortShift128Left(bSig1 | 0x1000000000000,zSig0,0xf,&bSig1,&zSig0);
    fVar1 = le128(bSig1,zSig0,aSig1,bSig0);
    if (fVar1 != '\0') {
      shift128Right(aSig1,bSig0,1,&aSig1,&bSig0);
      aSig0._0_4_ = (int)aSig0 + 1;
    }
    zSig1 = estimateDiv128To64(aSig1,bSig0,bSig1);
    mul128By64To192(bSig1,zSig0,zSig1,&term1,&term2,&term3);
    sub192(aSig1,bSig0,0,term1,term2,term3,&rem1,&rem2,&rem3);
    while ((long)rem1 < 0) {
      zSig1 = zSig1 - 1;
      add192(rem1,rem2,rem3,0,bSig1,zSig0,&rem1,&rem2,&rem3);
    }
    zSig2 = estimateDiv128To64(rem2,rem3,bSig1);
    if ((zSig2 & 0x3fff) < 5) {
      mul128By64To192(bSig1,zSig0,zSig2,&term2,&term3,&local_c8);
      sub192(rem2,rem3,0,term2,term3,local_c8,&rem2,&rem3,&term0);
      while ((long)rem2 < 0) {
        zSig2 = zSig2 - 1;
        add192(rem2,rem3,term0,0,bSig1,zSig0,&rem2,&rem3,&term0);
      }
      zSig2 = (long)(int)(uint)((rem2 != 0 || rem3 != 0) || term0 != 0) | zSig2;
    }
    shift128ExtraRightJamming(zSig1,zSig2,0,0xf,&zSig1,&zSig2,&rem0);
    join_0x00000010_0x00000000_ = roundAndPackFloat128(bExp._1_1_,(int)aSig0,zSig1,zSig2,rem0,_aExp)
    ;
  }
  return stack0xffffffffffffffe8;
}

Assistant:

float128 float128_div(float128 a, float128 b, float_status *status)
{
    flag aSign, bSign, zSign;
    int32_t aExp, bExp, zExp;
    uint64_t aSig0, aSig1, bSig0, bSig1, zSig0, zSig1, zSig2;
    uint64_t rem0, rem1, rem2, rem3, term0, term1, term2, term3;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    bSig1 = extractFloat128Frac1( b );
    bSig0 = extractFloat128Frac0( b );
    bExp = extractFloat128Exp( b );
    bSign = extractFloat128Sign( b );
    zSign = aSign ^ bSign;
    if ( aExp == 0x7FFF ) {
        if (aSig0 | aSig1) {
            return propagateFloat128NaN(a, b, status);
        }
        if ( bExp == 0x7FFF ) {
            if (bSig0 | bSig1) {
                return propagateFloat128NaN(a, b, status);
            }
            goto invalid;
        }
        return packFloat128( zSign, 0x7FFF, 0, 0 );
    }
    if ( bExp == 0x7FFF ) {
        if (bSig0 | bSig1) {
            return propagateFloat128NaN(a, b, status);
        }
        return packFloat128( zSign, 0, 0, 0 );
    }
    if ( bExp == 0 ) {
        if ( ( bSig0 | bSig1 ) == 0 ) {
            if ( ( aExp | aSig0 | aSig1 ) == 0 ) {
 invalid:
                float_raise(float_flag_invalid, status);
                return float128_default_nan(status);
            }
            float_raise(float_flag_divbyzero, status);
            return packFloat128( zSign, 0x7FFF, 0, 0 );
        }
        normalizeFloat128Subnormal( bSig0, bSig1, &bExp, &bSig0, &bSig1 );
    }
    if ( aExp == 0 ) {
        if ( ( aSig0 | aSig1 ) == 0 ) return packFloat128( zSign, 0, 0, 0 );
        normalizeFloat128Subnormal( aSig0, aSig1, &aExp, &aSig0, &aSig1 );
    }
    zExp = aExp - bExp + 0x3FFD;
    shortShift128Left(
        aSig0 | UINT64_C(0x0001000000000000), aSig1, 15, &aSig0, &aSig1 );
    shortShift128Left(
        bSig0 | UINT64_C(0x0001000000000000), bSig1, 15, &bSig0, &bSig1 );
    if ( le128( bSig0, bSig1, aSig0, aSig1 ) ) {
        shift128Right( aSig0, aSig1, 1, &aSig0, &aSig1 );
        ++zExp;
    }
    zSig0 = estimateDiv128To64( aSig0, aSig1, bSig0 );
    mul128By64To192( bSig0, bSig1, zSig0, &term0, &term1, &term2 );
    sub192( aSig0, aSig1, 0, term0, term1, term2, &rem0, &rem1, &rem2 );
    while ( (int64_t) rem0 < 0 ) {
        --zSig0;
        add192( rem0, rem1, rem2, 0, bSig0, bSig1, &rem0, &rem1, &rem2 );
    }
    zSig1 = estimateDiv128To64( rem1, rem2, bSig0 );
    if ( ( zSig1 & 0x3FFF ) <= 4 ) {
        mul128By64To192( bSig0, bSig1, zSig1, &term1, &term2, &term3 );
        sub192( rem1, rem2, 0, term1, term2, term3, &rem1, &rem2, &rem3 );
        while ( (int64_t) rem1 < 0 ) {
            --zSig1;
            add192( rem1, rem2, rem3, 0, bSig0, bSig1, &rem1, &rem2, &rem3 );
        }
        zSig1 |= ( ( rem1 | rem2 | rem3 ) != 0 );
    }
    shift128ExtraRightJamming( zSig0, zSig1, 0, 15, &zSig0, &zSig1, &zSig2 );
    return roundAndPackFloat128(zSign, zExp, zSig0, zSig1, zSig2, status);

}